

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImTriangulator::ReclassifyNode(ImTriangulator *this,ImTriangulatorNode *n1)

{
  ImTriangulatorNode **ppIVar1;
  float fVar2;
  ImTriangulatorNodeType IVar3;
  int iVar4;
  ImTriangulatorNode *pIVar5;
  ImTriangulatorNode *pIVar6;
  ImTriangulatorNodeSpan *pIVar7;
  bool bVar8;
  ImTriangulatorNodeType IVar9;
  uint uVar10;
  ImTriangulatorNode **ppIVar11;
  ImTriangulatorNode **ppIVar12;
  uint uVar13;
  float fVar14;
  
  pIVar5 = n1->Prev;
  pIVar6 = n1->Next;
  fVar14 = (n1->Pos).x;
  fVar2 = (n1->Pos).y;
  fVar14 = ((pIVar6->Pos).y - fVar2) * (fVar14 - (pIVar5->Pos).x) -
           (fVar2 - (pIVar5->Pos).y) * ((pIVar6->Pos).x - fVar14);
  if (0.0 < fVar14) {
    bVar8 = IsEar(this,pIVar5->Index,n1->Index,pIVar6->Index,&pIVar5->Pos,&n1->Pos,&pIVar6->Pos);
    IVar9 = (ImTriangulatorNodeType)bVar8;
  }
  else {
    IVar9 = ImTriangulatorNodeType_Reflex;
    bVar8 = false;
  }
  IVar3 = n1->Type;
  if (IVar9 == IVar3) {
    return;
  }
  if (IVar3 == ImTriangulatorNodeType_Ear) {
    pIVar7 = &this->_Ears;
    uVar10 = (this->_Ears).Size;
    ppIVar11 = (this->_Ears).Data;
    ppIVar12 = ppIVar11 + uVar10;
    uVar13 = uVar10;
    do {
      if ((int)uVar13 < 1) goto LAB_001a0f94;
      ppIVar1 = ppIVar12 + -1;
      ppIVar12 = ppIVar12 + -1;
      uVar13 = uVar13 - 1;
    } while ((*ppIVar1)->Index != n1->Index);
  }
  else {
    if (IVar3 != ImTriangulatorNodeType_Reflex) goto LAB_001a0f94;
    pIVar7 = &this->_Reflexes;
    uVar10 = (this->_Reflexes).Size;
    ppIVar11 = (this->_Reflexes).Data;
    ppIVar12 = ppIVar11 + uVar10;
    uVar13 = uVar10;
    do {
      if ((int)uVar13 < 1) goto LAB_001a0f94;
      ppIVar1 = ppIVar12 + -1;
      ppIVar12 = ppIVar12 + -1;
      uVar13 = uVar13 - 1;
    } while ((*ppIVar1)->Index != n1->Index);
  }
  *ppIVar12 = ppIVar11[(long)(int)uVar10 + -1];
  pIVar7->Size = uVar10 - 1;
LAB_001a0f94:
  if ((0.0 < fVar14 & (bVar8 ^ 1U)) == 0) {
    bVar8 = fVar14 <= 0.0;
    ppIVar12 = (&this->_Ears)[bVar8].Data;
    iVar4 = (&this->_Ears)[bVar8].Size;
    (&this->_Ears)[bVar8].Size = iVar4 + 1;
    ppIVar12[iVar4] = n1;
  }
  n1->Type = IVar9;
  return;
}

Assistant:

void ImTriangulator::ReclassifyNode(ImTriangulatorNode* n1)
{
    // Classify node
    ImTriangulatorNodeType type;
    const ImTriangulatorNode* n0 = n1->Prev;
    const ImTriangulatorNode* n2 = n1->Next;
    if (!ImTriangleIsClockwise(n0->Pos, n1->Pos, n2->Pos))
        type = ImTriangulatorNodeType_Reflex;
    else if (IsEar(n0->Index, n1->Index, n2->Index, n0->Pos, n1->Pos, n2->Pos))
        type = ImTriangulatorNodeType_Ear;
    else
        type = ImTriangulatorNodeType_Convex;

    // Update lists when a type changes
    if (type == n1->Type)
        return;
    if (n1->Type == ImTriangulatorNodeType_Reflex)
        _Reflexes.find_erase_unsorted(n1->Index);
    else if (n1->Type == ImTriangulatorNodeType_Ear)
        _Ears.find_erase_unsorted(n1->Index);
    if (type == ImTriangulatorNodeType_Reflex)
        _Reflexes.push_back(n1);
    else if (type == ImTriangulatorNodeType_Ear)
        _Ears.push_back(n1);
    n1->Type = type;
}